

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

string * __thiscall
deqp::gls::ShaderExecUtil::TessControlExecutor::generateTessControlShader_abi_cxx11_
          (string *__return_storage_ptr__,TessControlExecutor *this,ShaderSpec *shaderSpec)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  ulong uVar4;
  int local_1a4;
  int local_1a0;
  int ndx_1;
  int ndx;
  undefined1 local_190 [8];
  ostringstream src;
  ShaderSpec *shaderSpec_local;
  
  src._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  pcVar2 = glu::getGLSLVersionDeclaration(*(GLSLVersion *)src._368_8_);
  poVar3 = std::operator<<((ostream *)local_190,pcVar2);
  std::operator<<(poVar3,"\n");
  bVar1 = glu::glslVersionIsES(*(GLSLVersion *)src._368_8_);
  if ((bVar1) && (*(int *)src._368_8_ < 3)) {
    std::operator<<((ostream *)local_190,"#extension GL_EXT_tessellation_shader : require\n");
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)local_190,(string *)(src._368_8_ + 0x38));
    std::operator<<(poVar3,"\n");
  }
  std::operator<<((ostream *)local_190,"\nlayout(vertices = 1) out;\n\n");
  BufferIoExecutor::declareBufferBlocks((ostream *)local_190,(ShaderSpec *)src._368_8_);
  std::operator<<((ostream *)local_190,"void main (void)\n{\n");
  for (local_1a0 = 0; local_1a0 < 2; local_1a0 = local_1a0 + 1) {
    poVar3 = std::operator<<((ostream *)local_190,"\tgl_TessLevelInner[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1a0);
    std::operator<<(poVar3,"] = 1.0;\n");
  }
  for (local_1a4 = 0; local_1a4 < 4; local_1a4 = local_1a4 + 1) {
    poVar3 = std::operator<<((ostream *)local_190,"\tgl_TessLevelOuter[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1a4);
    std::operator<<(poVar3,"] = 1.0;\n");
  }
  poVar3 = std::operator<<((ostream *)local_190,"\n");
  std::operator<<(poVar3,"\thighp uint invocationId = uint(gl_PrimitiveID);\n");
  BufferIoExecutor::generateExecBufferIo
            ((ostream *)local_190,(ShaderSpec *)src._368_8_,"invocationId");
  std::operator<<((ostream *)local_190,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string TessControlExecutor::generateTessControlShader (const ShaderSpec& shaderSpec)
{
	std::ostringstream src;

	src << glu::getGLSLVersionDeclaration(shaderSpec.version) << "\n";

	if (glu::glslVersionIsES(shaderSpec.version) && shaderSpec.version <= glu::GLSL_VERSION_310_ES)
		src << "#extension GL_EXT_tessellation_shader : require\n";

	if (!shaderSpec.globalDeclarations.empty())
		src << shaderSpec.globalDeclarations << "\n";

	src << "\nlayout(vertices = 1) out;\n\n";

	declareBufferBlocks(src, shaderSpec);

	src << "void main (void)\n{\n";

	for (int ndx = 0; ndx < 2; ndx++)
		src << "\tgl_TessLevelInner[" << ndx << "] = 1.0;\n";

	for (int ndx = 0; ndx < 4; ndx++)
		src << "\tgl_TessLevelOuter[" << ndx << "] = 1.0;\n";

	src << "\n"
		<< "\thighp uint invocationId = uint(gl_PrimitiveID);\n";

	generateExecBufferIo(src, shaderSpec, "invocationId");

	src << "}\n";

	return src.str();
}